

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

int __thiscall GGSock::Communicator::listen(Communicator *this,int __fd,int __n)

{
  uint uVar1;
  FILE *__stream;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  Data *pDVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 extraout_RAX;
  int in_ECX;
  bool success_1;
  bool success;
  int res;
  sockaddr_in *addr;
  int enable;
  lock_guard<std::mutex> lock;
  Data *data;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  int local_58;
  int local_54;
  sockaddr *local_50;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffbc;
  int local_18;
  int local_14;
  Communicator *local_10;
  bool local_1;
  
  local_18 = __n;
  local_14 = __fd;
  local_10 = this;
  pDVar5 = getData((Communicator *)0x12cb3f);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,
             (mutex_type *)
             CONCAT17(in_stack_ffffffffffffff8f,
                      CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  if ((pDVar5->isConnected & 1U) == 0) {
    if ((pDVar5->isListening & 1U) == 0) {
      anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12cba2);
      iVar4 = socket(2,1,6);
      pDVar5->sd = iVar4;
      if (pDVar5->sd < 0) {
        anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12cbdb);
        __stream = _stderr;
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(__stream,"Error creating socket (%d %s)\n",(ulong)uVar1,pcVar8);
        local_1 = false;
      }
      else {
        uVar9 = 1;
        iVar4 = setsockopt(pDVar5->sd,1,2,&stack0xffffffffffffffb8,4);
        if (iVar4 < 0) {
          fprintf(_stderr,"setsockopt(SO_REUSEADDR) failed");
        }
        iVar4 = setsockopt(pDVar5->sd,1,0xf,&stack0xffffffffffffffb8,4);
        if (iVar4 < 0) {
          fprintf(_stderr,"setsockopt(SO_REUSEPORT) failed");
        }
        local_50 = (sockaddr *)&pDVar5->addr;
        memset(local_50,0,0x10);
        local_50->sa_family = 2;
        ((in_addr *)((long)local_50->sa_data + 2))->s_addr = 0;
        uVar3 = htons((uint16_t)local_14);
        *(uint16_t *)local_50->sa_data = uVar3;
        local_54 = bind(pDVar5->sd,local_50,0x10);
        if (local_54 == -1) {
          perror("Bind failed");
          fprintf(_stderr,"Error: bind failed");
          local_1 = false;
        }
        else {
          local_54 = ::listen(pDVar5->sd,in_ECX);
          if (local_54 == -1) {
            fprintf(_stderr,"Error: listen failed");
            local_1 = false;
          }
          else {
            anon_unknown.dwarf_7001::setNonBlocking((TSocketDescriptor *)in_stack_ffffffffffffff90);
            pDVar5->isServer = true;
            pDVar5->isListening = true;
            local_58 = 0;
            piVar7 = std::max<int>(&local_58,&local_18);
            pDVar5->timeoutListen_ms = *piVar7;
            if (local_18 < 1) {
              if (local_18 < 0) {
                pDVar5->timeoutListen_ms = 1;
                do {
                  if ((pDVar5->isListening & 1U) == 0) {
                    local_1 = false;
                    goto LAB_0012cec2;
                  }
                  bVar2 = Data::doListen((Data *)CONCAT44(in_stack_ffffffffffffffbc,uVar9));
                } while (!bVar2);
                pDVar5->isListening = false;
                local_1 = true;
              }
              else {
                local_1 = true;
              }
            }
            else {
              local_1 = Data::doListen((Data *)CONCAT44(in_stack_ffffffffffffffbc,uVar9));
              pDVar5->isListening = false;
            }
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_0012cec2:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12cecc);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool Communicator::listen(TPort port, int32_t timeout_ms, int32_t maxConnections) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isConnected) return false;
        if (data.isListening) return false;

        ::closeAndReset(data.sd);

        data.sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        if (data.sd < 0) {
            ::closeAndReset(data.sd);
            fprintf(stderr, "Error creating socket (%d %s)\n", errno, strerror(errno));
            return false;
        }

        int enable = 1;
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
        }

#ifndef _WIN32
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
        }
#endif

        //{
        //    linger lin;
        //    lin.l_onoff = 0;
        //    lin.l_linger = 0;
        //    if (setsockopt(data.sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
        //    }
        //}

        auto & addr = data.addr;

        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = INADDR_ANY;
        addr.sin_port = htons(port);

        int res = bind(data.sd, (struct sockaddr *)&addr, sizeof(addr));
        if (res == -1) {
            perror("Bind failed");
            fprintf(stderr, "Error: bind failed");
            return false;
        }

        res = ::listen(data.sd, maxConnections);
        if (res == -1) {
            fprintf(stderr, "Error: listen failed");
            return false;
        }

        ::setNonBlocking(data.sd);

        data.isServer = true;
        data.isListening = true;

        data.timeoutListen_ms = (std::max)(0, timeout_ms);
        if (timeout_ms > 0) {
            bool success = data.doListen();

            data.isListening = false;
            return success;
        } else if (timeout_ms < 0) {
            data.timeoutListen_ms = 1;
            while (data.isListening) {
                bool success = data.doListen();
                if (success) {
                    data.isListening = false;
                    return true;
                }
            }
            return false;
        }

        return true;
    }